

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1552.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  timeval tVar12;
  int still_running;
  int num;
  int local_44;
  long local_40;
  undefined1 local_34 [4];
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                  ,0x2a,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_multi_init();
    iVar9 = 0;
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                    ,0x2c);
      iVar3 = 0x7b;
      lVar6 = 0;
    }
    else {
      lVar6 = curl_easy_init();
      iVar9 = 0;
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                      ,0x2e);
        iVar3 = 0x7c;
      }
      else {
        iVar9 = 0;
        iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
        uVar1 = _stderr;
        iVar3 = 0;
        if (iVar2 != 0) {
          uVar4 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                        ,0x30,iVar2,uVar4);
          iVar3 = iVar2;
        }
        if (iVar3 == 0) {
          iVar9 = 0;
          iVar2 = curl_easy_setopt(lVar6,0x2a,1);
          uVar1 = _stderr;
          iVar3 = 0;
          if (iVar2 != 0) {
            uVar4 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                          ,0x31,iVar2,uVar4);
            iVar3 = iVar2;
          }
          if (iVar3 == 0) {
            iVar9 = 0;
            iVar2 = curl_easy_setopt(lVar6,0x29,1);
            uVar1 = _stderr;
            iVar3 = 0;
            if (iVar2 != 0) {
              uVar4 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                            ,0x32,iVar2,uVar4);
              iVar3 = iVar2;
            }
            if (iVar3 == 0) {
              iVar9 = 0;
              iVar2 = curl_easy_setopt(lVar6,0x2715,"u:s");
              uVar1 = _stderr;
              iVar3 = 0;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                              ,0x33,iVar2,uVar4);
                iVar3 = iVar2;
              }
              if (iVar3 == 0) {
                iVar2 = curl_multi_add_handle(lVar5,lVar6);
                uVar1 = _stderr;
                iVar9 = 0;
                iVar3 = 0;
                if (iVar2 != 0) {
                  uVar4 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                ,0x35,iVar2,uVar4);
                  iVar3 = iVar2;
                }
                if (iVar3 == 0) {
                  iVar3 = curl_multi_perform(lVar5,&local_44);
                  uVar1 = _stderr;
                  if (iVar3 == 0) {
                    iVar3 = 0;
                    if (local_44 < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                    ,0x37);
                      iVar3 = 0x7a;
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                  ,0x37,iVar3,uVar4);
                  }
                  if (iVar3 == 0) {
                    tVar12 = tutil_tvnow();
                    lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                    iVar9 = 0;
                    if (lVar7 < 0xea61) {
                      iVar2 = 0;
                      iVar9 = 0;
                      iVar3 = 0;
                      if (local_44 != 0) {
                        iVar10 = -2;
                        local_40 = lVar5;
                        do {
                          iVar3 = curl_multi_wait(lVar5,0,0,60000,local_34);
                          if (iVar3 == 0) {
                            tVar12 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                            iVar3 = 0;
                            if (60000 < lVar7) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                            ,0x44);
                              iVar3 = 0x7d;
                            }
                            iVar8 = 0xc;
                            lVar5 = local_40;
                            if (lVar7 < 0xea61) {
                              iVar3 = curl_multi_perform(local_40);
                              uVar1 = _stderr;
                              if (iVar3 == 0) {
                                iVar3 = 0;
                                if (local_44 < 0) {
                                  curl_mfprintf(_stderr,
                                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                                ,0x46);
                                  iVar3 = 0x7a;
                                }
                              }
                              else {
                                uVar4 = curl_multi_strerror(iVar3);
                                curl_mfprintf(uVar1,
                                              "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                              ,0x46,iVar3,uVar4);
                              }
                              lVar5 = local_40;
                              if (iVar3 == 0) {
                                tVar12 = tutil_tvnow();
                                lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                                iVar8 = 0;
                                iVar3 = 0;
                                if (lVar7 < 0xea61) goto LAB_001016da;
                                curl_mfprintf(_stderr,
                                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                              ,0x48);
                                iVar3 = 0x7d;
                              }
                              goto LAB_001016d5;
                            }
                          }
                          else {
                            curl_mprintf("curl_multi_wait() returned %d\n");
                            iVar3 = 0x7e;
LAB_001016d5:
                            iVar8 = 0xc;
                          }
LAB_001016da:
                          if (iVar8 != 0) {
                            if (iVar8 != 0xc) goto LAB_001015dd;
                            iVar9 = 0;
                            goto LAB_001015c3;
                          }
                        } while ((local_44 != 0) &&
                                (bVar11 = iVar10 != 0, iVar10 = iVar10 + 1, bVar11));
                      }
                      lVar7 = curl_multi_info_read(lVar5,&local_44);
                      if (lVar7 != 0) {
                        iVar9 = *(int *)(lVar7 + 0x10);
                      }
                    }
                    else {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                                    ,0x39);
                      iVar3 = 0x7d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001015c3:
    curl_multi_cleanup(lVar5);
    curl_easy_cleanup(lVar6);
    curl_global_cleanup();
    iVar2 = iVar9;
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
  }
LAB_001015dd:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  CURLMsg *msg;
  int counter = 3;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}